

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O0

void WebPRescalerImportRowExpand_C(WebPRescaler *wrk,uint8_t *src)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint local_34;
  rescaler_t right;
  rescaler_t left;
  int accum;
  int x_out;
  int x_in;
  int channel;
  int x_out_max;
  int x_stride;
  uint8_t *src_local;
  WebPRescaler *wrk_local;
  
  iVar1 = wrk->num_channels;
  iVar2 = wrk->dst_width;
  iVar3 = wrk->num_channels;
  for (channel = 0; channel < iVar1; channel = channel + 1) {
    x_out = channel;
    accum = wrk->x_add;
    left = (rescaler_t)src[channel];
    local_34 = left;
    if (1 < wrk->src_width) {
      local_34 = (uint)src[channel + iVar1];
    }
    right = local_34;
    x_in = iVar1 + channel;
    while( true ) {
      wrk->frow[x_out] = right * wrk->x_add + (left - right) * accum;
      x_out = iVar1 + x_out;
      if (iVar2 * iVar3 <= x_out) break;
      accum = accum - wrk->x_sub;
      if (accum < 0) {
        left = right;
        x_in = iVar1 + x_in;
        right = (rescaler_t)src[x_in];
        accum = wrk->x_add + accum;
      }
    }
  }
  return;
}

Assistant:

void WebPRescalerImportRowExpand_C(WebPRescaler* const wrk,
                                   const uint8_t* src) {
  const int x_stride = wrk->num_channels;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  int channel;
  assert(!WebPRescalerInputDone(wrk));
  assert(wrk->x_expand);
  for (channel = 0; channel < x_stride; ++channel) {
    int x_in = channel;
    int x_out = channel;
    // simple bilinear interpolation
    int accum = wrk->x_add;
    rescaler_t left = (rescaler_t)src[x_in];
    rescaler_t right =
        (wrk->src_width > 1) ? (rescaler_t)src[x_in + x_stride] : left;
    x_in += x_stride;
    while (1) {
      wrk->frow[x_out] = right * wrk->x_add + (left - right) * accum;
      x_out += x_stride;
      if (x_out >= x_out_max) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        left = right;
        x_in += x_stride;
        assert(x_in < wrk->src_width * x_stride);
        right = (rescaler_t)src[x_in];
        accum += wrk->x_add;
      }
    }
    assert(wrk->x_sub == 0 /* <- special case for src_width=1 */ || accum == 0);
  }
}